

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O3

object * do_Integer(int op,object *low,object *high)

{
  object *poVar1;
  object **ppoVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  
  if (6 < op - 0x19U) {
    error_impl("do_Integer",0x2a0,"do_Integer(): Invalid primitive integer operation %d!");
    return (object *)0x0;
  }
  uVar3 = low[1].header;
  uVar4 = high[1].header;
  switch(op) {
  case 0x19:
    if (uVar4 == 0) {
      return (object *)0x0;
    }
    uVar3 = (long)uVar3 / (long)uVar4;
    break;
  case 0x1a:
    if (uVar4 == 0) {
      return (object *)0x0;
    }
    uVar3 = (long)uVar3 % (long)uVar4;
    break;
  case 0x1b:
    uVar4 = uVar4 + uVar3;
    goto LAB_0010b89c;
  case 0x1c:
    uVar4 = uVar4 * uVar3;
LAB_0010b89c:
    poVar1 = gcialloc(8);
    poVar1->class = IntegerClass;
    poVar1[1].header = uVar4;
    return poVar1;
  case 0x1d:
    uVar3 = uVar3 - uVar4;
    break;
  case 0x1e:
    if ((long)uVar3 < (long)uVar4) {
LAB_0010b911:
      ppoVar2 = &trueObject;
      goto LAB_0010b926;
    }
    goto LAB_0010b91f;
  case 0x1f:
    if (uVar3 == uVar4) goto LAB_0010b911;
LAB_0010b91f:
    ppoVar2 = &falseObject;
LAB_0010b926:
    return *ppoVar2;
  }
  poVar1 = gcialloc(8);
  poVar1->class = IntegerClass;
  poVar1[1].header = uVar3;
  return poVar1;
}

Assistant:

struct object *do_Integer(int op, struct object *low, struct object *high)
{
    int64_t l, h;
    int64_t *tmp;

    tmp = (int64_t *)bytePtr(low);
    l = *tmp;
    tmp = (int64_t *)bytePtr(high);
    h = *tmp;
    switch (op) {
    case 25:    /* Integer division */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l/h));

    case 26:    /* Integer remainder */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l%h));

    case 27:    /* Integer addition */
        return(newLInteger(l+h));

    case 28:    /* Integer multiplication */
        return(newLInteger(l*h));

    case 29:    /* Integer subtraction */
        return(newLInteger(l-h));

    case 30:    /* Integer less than */
        return((l < h) ? trueObject : falseObject);

    case 31:    /* Integer equality */
        return((l == h) ? trueObject : falseObject);

    default:
        error("do_Integer(): Invalid primitive integer operation %d!", op);
    }
    return(NULL);
}